

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrDEC0xc6(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  
  addr = this->PC;
  this->PC = addr + 1;
  bVar1 = Memory::Read8(this->m,addr);
  this_00 = this->m;
  uVar2 = Memory::Read8(this_00,(ushort)bVar1);
  uVar2 = uVar2 + 0xff;
  if (uVar2 == '\0') {
    bVar3 = this->field_0x2e | 0x40;
  }
  else {
    bVar3 = this->field_0x2e & 0xbf;
    if ((char)uVar2 < '\0') {
      bVar3 = bVar3 | 1;
      goto LAB_0010ee35;
    }
  }
  bVar3 = bVar3 & 0xfe;
LAB_0010ee35:
  this->field_0x2e = bVar3;
  Memory::Write8(this_00,(ushort)bVar1,uVar2);
  return 5;
}

Assistant:

int CPU::instrDEC0xc6() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 5;
}